

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleAddRow_16_C(uint16_t *src_ptr,uint32_t *dst_ptr,int src_width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < src_width + -1; lVar1 = lVar1 + 2) {
    *(ulong *)(dst_ptr + lVar1) =
         CONCAT44((int)((ulong)*(undefined8 *)(dst_ptr + lVar1) >> 0x20) +
                  (*(uint *)(src_ptr + lVar1) >> 0x10),
                  (int)*(undefined8 *)(dst_ptr + lVar1) + (*(uint *)(src_ptr + lVar1) & 0xffff));
  }
  if ((src_width & 1U) != 0) {
    dst_ptr[lVar1] = dst_ptr[lVar1] + (uint)src_ptr[lVar1];
  }
  return;
}

Assistant:

void ScaleAddRow_16_C(const uint16_t* src_ptr,
                      uint32_t* dst_ptr,
                      int src_width) {
  int x;
  assert(src_width > 0);
  for (x = 0; x < src_width - 1; x += 2) {
    dst_ptr[0] += src_ptr[0];
    dst_ptr[1] += src_ptr[1];
    src_ptr += 2;
    dst_ptr += 2;
  }
  if (src_width & 1) {
    dst_ptr[0] += src_ptr[0];
  }
}